

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_fmtimer.cpp
# Opt level: O0

void __thiscall FM::Timer::SetTimerControl(Timer *this,uint data)

{
  uint uVar1;
  int32 local_28;
  int32 local_24;
  uint tmp;
  uint data_local;
  Timer *this_local;
  
  uVar1 = this->regtc ^ data;
  this->regtc = (uint8)data;
  if ((data & 0x10) != 0) {
    (*this->_vptr_Timer[1])(this,1);
  }
  if ((data & 0x20) != 0) {
    (*this->_vptr_Timer[1])(this,2);
  }
  if ((uVar1 & 1) != 0) {
    if ((data & 1) == 0) {
      local_24 = 0;
    }
    else {
      local_24 = this->timera;
    }
    this->timera_count = local_24;
  }
  if ((uVar1 & 2) != 0) {
    if ((data & 2) == 0) {
      local_28 = 0;
    }
    else {
      local_28 = this->timerb;
    }
    this->timerb_count = local_28;
  }
  return;
}

Assistant:

void Timer::SetTimerControl(uint data)
{
	uint tmp = regtc ^ data;
	regtc = uint8(data);
	
	if (data & 0x10) 
		ResetStatus(1);
	if (data & 0x20) 
		ResetStatus(2);

	if (tmp & 0x01)
		timera_count = (data & 1) ? timera : 0;
	if (tmp & 0x02)
		timerb_count = (data & 2) ? timerb : 0;
}